

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testUTF8.cxx
# Opt level: O1

void byte_array_print(char *s)

{
  char cVar1;
  bool bVar2;
  char *pcVar3;
  
  putchar(0x5b);
  if (*s != '\0') {
    pcVar3 = s + 1;
    bVar2 = false;
    do {
      if (bVar2) {
        putchar(0x2c);
      }
      printf("0x%02X",(ulong)(byte)pcVar3[-1]);
      cVar1 = *pcVar3;
      pcVar3 = pcVar3 + 1;
      bVar2 = true;
    } while (cVar1 != '\0');
  }
  putchar(0x5d);
  return;
}

Assistant:

static void byte_array_print(char const* s)
{
  unsigned char const* d = reinterpret_cast<unsigned char const*>(s);
  bool started = false;
  printf("[");
  for (; *d; ++d) {
    if (started) {
      printf(",");
    }
    started = true;
    printf("0x%02X", static_cast<int>(*d));
  }
  printf("]");
}